

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * LoadImageRaw(Image *__return_storage_ptr__,char *fileName,int width,int height,int format,
                    int headerSize)

{
  uint uVar1;
  uchar *__ptr;
  void *pvVar2;
  uchar *puStack_38;
  uint size;
  uchar *dataPtr;
  uchar *fileData;
  int local_20;
  uint dataSize;
  int headerSize_local;
  int format_local;
  int height_local;
  int width_local;
  char *fileName_local;
  
  local_20 = headerSize;
  dataSize = format;
  headerSize_local = height;
  format_local = width;
  _height_local = fileName;
  memset(__return_storage_ptr__,0,0x18);
  fileData._4_4_ = 0;
  __ptr = LoadFileData(_height_local,(uint *)((long)&fileData + 4));
  if (__ptr != (uchar *)0x0) {
    uVar1 = GetPixelDataSize(format_local,headerSize_local,dataSize);
    puStack_38 = __ptr;
    if (0 < local_20) {
      puStack_38 = __ptr + local_20;
    }
    pvVar2 = malloc((ulong)uVar1);
    __return_storage_ptr__->data = pvVar2;
    memcpy(__return_storage_ptr__->data,puStack_38,(ulong)uVar1);
    __return_storage_ptr__->width = format_local;
    __return_storage_ptr__->height = headerSize_local;
    __return_storage_ptr__->mipmaps = 1;
    __return_storage_ptr__->format = dataSize;
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

Image LoadImageRaw(const char *fileName, int width, int height, int format, int headerSize)
{
    Image image = { 0 };

    unsigned int dataSize = 0;
    unsigned char *fileData = LoadFileData(fileName, &dataSize);

    if (fileData != NULL)
    {
        unsigned char *dataPtr = fileData;
        unsigned int size = GetPixelDataSize(width, height, format);

        if (headerSize > 0) dataPtr += headerSize;

        image.data = RL_MALLOC(size);      // Allocate required memory in bytes
        memcpy(image.data, dataPtr, size); // Copy required data to image
        image.width = width;
        image.height = height;
        image.mipmaps = 1;
        image.format = format;

        RL_FREE(fileData);
    }

    return image;
}